

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

char * IDAGetLinReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"IDALS_SUCCESS");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"IDALS_SUNLS_FAIL");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"IDALS_SUNMAT_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"IDALS_JACFUNC_RECVR");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"IDALS_JACFUNC_UNRECVR");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"IDALS_PMEM_NULL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"IDALS_MEM_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"IDALS_ILL_INPUT");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"IDALS_LMEM_NULL");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"IDALS_MEM_NULL");
  }
  return __s;
}

Assistant:

char* IDAGetLinReturnFlagName(long int flag)
{
  char* name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case IDALS_SUCCESS: sprintf(name, "IDALS_SUCCESS"); break;
  case IDALS_MEM_NULL: sprintf(name, "IDALS_MEM_NULL"); break;
  case IDALS_LMEM_NULL: sprintf(name, "IDALS_LMEM_NULL"); break;
  case IDALS_ILL_INPUT: sprintf(name, "IDALS_ILL_INPUT"); break;
  case IDALS_MEM_FAIL: sprintf(name, "IDALS_MEM_FAIL"); break;
  case IDALS_PMEM_NULL: sprintf(name, "IDALS_PMEM_NULL"); break;
  case IDALS_JACFUNC_UNRECVR: sprintf(name, "IDALS_JACFUNC_UNRECVR"); break;
  case IDALS_JACFUNC_RECVR: sprintf(name, "IDALS_JACFUNC_RECVR"); break;
  case IDALS_SUNMAT_FAIL: sprintf(name, "IDALS_SUNMAT_FAIL"); break;
  case IDALS_SUNLS_FAIL: sprintf(name, "IDALS_SUNLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}